

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::SerializeToZeroCopyStream
          (MessageLite *this,ZeroCopyOutputStream *output)

{
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  MessageLite *message;
  LogFinisher local_79;
  string local_78;
  LogMessage local_58;
  
  iVar2 = (*this->_vptr_MessageLite[6])();
  if ((char)iVar2 == '\0') {
    message = (MessageLite *)0x192;
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,"third_party/protobuf-lite/message_lite.cc",0x192);
    pLVar3 = internal::LogMessage::operator<<(&local_58,"CHECK failed: IsInitialized(): ");
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_78,(_anonymous_namespace_ *)"serialize",(char *)this,message);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,&local_78);
    internal::LogFinisher::operator=(&local_79,pLVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char)iVar2 == '\0') {
    internal::LogMessage::~LogMessage(&local_58);
  }
  bVar1 = SerializePartialToZeroCopyStream(this,output);
  return bVar1;
}

Assistant:

bool MessageLite::SerializeToZeroCopyStream(
    io::ZeroCopyOutputStream* output) const {
  GOOGLE_DCHECK(IsInitialized()) << InitializationErrorMessage("serialize", *this);
  return SerializePartialToZeroCopyStream(output);
}